

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TraditionalHammerer.cpp
# Opt level: O1

void TraditionalHammerer::hammer
               (vector<volatile_char_*,_std::allocator<volatile_char_*>_> *aggressors,size_t reps)

{
  pointer ppcVar1;
  size_t sVar2;
  iterator __begin2;
  pointer ppcVar3;
  char **a;
  pointer ppcVar4;
  
  if (reps != 0) {
    sVar2 = 0;
    do {
      ppcVar1 = (aggressors->super__Vector_base<volatile_char_*,_std::allocator<volatile_char_*>_>).
                _M_impl.super__Vector_impl_data._M_finish;
      ppcVar3 = (aggressors->super__Vector_base<volatile_char_*,_std::allocator<volatile_char_*>_>).
                _M_impl.super__Vector_impl_data._M_start;
      for (ppcVar4 = ppcVar3; ppcVar4 != ppcVar1; ppcVar4 = ppcVar4 + 1) {
      }
      for (; ppcVar3 != ppcVar1; ppcVar3 = ppcVar3 + 1) {
        clflushopt(**ppcVar3);
      }
      sVar2 = sVar2 + 1;
    } while (sVar2 != reps);
  }
  return;
}

Assistant:

void TraditionalHammerer::hammer(std::vector<volatile char *> &aggressors, size_t reps) {
  for (size_t i = 0; i < reps; i++) {
    for (auto &a : aggressors) {
      (void)*a;
    }
    for (auto &a : aggressors) {
      clflushopt(a);
    }
    mfence();
  }
}